

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_encoding
pugi::impl::anon_unknown_0::get_buffer_encoding(xml_encoding encoding,void *contents,size_t size)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  xml_encoding xVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  byte *pbVar10;
  xml_encoding xVar11;
  ulong uVar12;
  bool bVar13;
  
  switch(encoding) {
  case encoding_auto:
    break;
  default:
    return encoding;
  case encoding_utf16:
    return encoding_utf16_le;
  case encoding_utf32:
  case encoding_wchar:
    return encoding_utf32_le;
  }
  if (size < 4) {
    return encoding_utf8;
  }
  bVar1 = *contents;
  bVar9 = *(byte *)((long)contents + 1);
  cVar2 = *(char *)((long)contents + 2);
  cVar3 = *(char *)((long)contents + 3);
  if ((cVar2 == -2 && (bVar1 == 0 && bVar9 == 0)) && cVar3 == -1) {
    return encoding_utf32_be;
  }
  if ((((bVar9 ^ 0xfe) == 0 && bVar1 == 0xff) && cVar2 == '\0') && cVar3 == '\0') {
    return encoding_utf32_le;
  }
  if ((bVar9 ^ 0xfe) == 0 && bVar1 == 0xff || bVar9 == 0xff && bVar1 == 0xfe) {
    return (bVar9 == 0xff && bVar1 == 0xfe) | encoding_utf16_le;
  }
  if (cVar2 == -0x41 && (bVar9 == 0xbb && bVar1 == 0xef)) {
    return encoding_utf8;
  }
  if (((bVar1 == 0 && bVar9 == 0) && cVar2 == '\0') && cVar3 == '<') {
    return encoding_utf32_be;
  }
  bVar4 = bVar1 ^ 0x3c;
  if (((bVar4 == 0 && bVar9 == 0) && cVar2 == '\0') && cVar3 == '\0') {
    return encoding_utf32_le;
  }
  bVar13 = (bVar9 ^ 0x3c) == 0 && bVar1 == 0;
  if (cVar3 == '?' && (((bVar9 ^ 0x3c) == 0 && bVar1 == 0) && cVar2 == '\0')) {
    return encoding_utf16_be;
  }
  xVar11 = bVar13 | encoding_utf16_le;
  xVar5 = encoding_utf16_le;
  if (cVar2 != '?' || cVar3 != '\0') {
    xVar5 = xVar11;
  }
  if (bVar4 != 0 || bVar9 != 0) {
    xVar5 = xVar11;
  }
  if (bVar4 == 0 && bVar9 == 0 || bVar13) {
    return xVar5;
  }
  if (size < 6) {
    return encoding_utf8;
  }
  if (bVar1 != 0x3c) {
    return encoding_utf8;
  }
  if (bVar9 != 0x3f) {
    return encoding_utf8;
  }
  if (cVar2 != 'x') {
    return encoding_utf8;
  }
  if (cVar3 != 'm') {
    return encoding_utf8;
  }
  if (*(char *)((long)contents + 4) != 'l') {
    return encoding_utf8;
  }
  if (((anonymous_namespace)::chartype_table[*(byte *)((long)contents + 5)] & 8) == 0) {
    return encoding_utf8;
  }
  uVar6 = 0xe;
  do {
    if (size <= uVar6 - 7) {
      return encoding_utf8;
    }
    cVar2 = *(char *)((long)contents + (uVar6 - 8));
    if (cVar2 == 'e') {
      if (*(char *)((long)contents + (uVar6 - 7)) == 'n') {
        if (size <= uVar6 - 6) {
          return encoding_utf8;
        }
        if (*(char *)((long)contents + (uVar6 - 6)) != 'c') {
          return encoding_utf8;
        }
        if (size <= uVar6 - 5) {
          return encoding_utf8;
        }
        if (*(char *)((long)contents + (uVar6 - 5)) != 'o') {
          return encoding_utf8;
        }
        if (size <= uVar6 - 4) {
          return encoding_utf8;
        }
        if (*(char *)((long)contents + (uVar6 - 4)) != 'd') {
          return encoding_utf8;
        }
        if (size <= uVar6 - 3) {
          return encoding_utf8;
        }
        if (*(char *)((long)contents + (uVar6 - 3)) != 'i') {
          return encoding_utf8;
        }
        if (size <= uVar6 - 2) {
          return encoding_utf8;
        }
        if (*(char *)((long)contents + (uVar6 - 2)) != 'n') {
          return encoding_utf8;
        }
        if (size <= uVar6 - 1) {
          return encoding_utf8;
        }
        if (*(char *)((long)contents + (uVar6 - 1)) != 'g') {
          return encoding_utf8;
        }
        while( true ) {
          if (size <= uVar6) {
            return encoding_utf8;
          }
          if (((anonymous_namespace)::chartype_table[*(byte *)((long)contents + uVar6)] & 8) == 0)
          break;
          uVar6 = uVar6 + 1;
        }
        if (*(byte *)((long)contents + uVar6) != 0x3d) {
          return encoding_utf8;
        }
        uVar6 = uVar6 + 1;
        do {
          uVar7 = uVar6;
          if (size <= uVar7) {
            return encoding_utf8;
          }
          bVar1 = *(byte *)((long)contents + uVar7);
          uVar6 = uVar7 + 1;
        } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
        bVar9 = (bVar1 != 0x22) * '\x05' + 0x22;
        if (bVar9 == bVar1) {
          pbVar10 = (byte *)((long)contents + uVar6);
          lVar8 = 0;
          for (uVar12 = uVar6; uVar12 < size; uVar12 = uVar12 + 1) {
            if (((anonymous_namespace)::chartype_table[*pbVar10] & 0x40) == 0) {
              if (bVar9 != *pbVar10) {
                return encoding_utf8;
              }
              if (lVar8 == 6) {
                if ((*(byte *)((long)contents + uVar6) & 0xdf) != 0x4c) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar7 + 2) & 0xdf) != 0x41) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar7 + 3) & 0xdf) != 0x54) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar7 + 4) & 0xdf) != 0x49) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar7 + 5) & 0xdf) != 0x4e) {
                  return encoding_utf8;
                }
                cVar2 = *(char *)((long)contents + uVar7 + 6);
              }
              else {
                if (lVar8 != 10) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar6) & 0xdf) != 0x49) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar7 + 2) & 0xdf) != 0x53) {
                  return encoding_utf8;
                }
                if ((*(byte *)((long)contents + uVar7 + 3) & 0xdf) != 0x4f) {
                  return encoding_utf8;
                }
                if (*(char *)((long)contents + uVar7 + 4) != '-') {
                  return encoding_utf8;
                }
                if (*(char *)((long)contents + uVar7 + 5) != '8') {
                  return encoding_utf8;
                }
                if (*(char *)((long)contents + uVar7 + 6) != '8') {
                  return encoding_utf8;
                }
                if (*(char *)((long)contents + uVar7 + 7) != '5') {
                  return encoding_utf8;
                }
                if (*(char *)((long)contents + uVar7 + 8) != '9') {
                  return encoding_utf8;
                }
                if (*(char *)((long)contents + uVar7 + 9) != '-') {
                  return encoding_utf8;
                }
                cVar2 = *(char *)((long)contents + uVar7 + 10);
              }
              if (cVar2 != '1') {
                return encoding_utf8;
              }
              return encoding_latin1;
            }
            lVar8 = lVar8 + 1;
            pbVar10 = pbVar10 + 1;
          }
        }
        return encoding_utf8;
      }
    }
    else if (cVar2 == '?') {
      return encoding_utf8;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

PUGI__FN xml_encoding get_buffer_encoding(xml_encoding encoding, const void* contents, size_t size)
	{
		// replace wchar encoding with utf implementation
		if (encoding == encoding_wchar) return get_wchar_encoding();

		// replace utf16 encoding with utf16 with specific endianness
		if (encoding == encoding_utf16) return is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

		// replace utf32 encoding with utf32 with specific endianness
		if (encoding == encoding_utf32) return is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

		// only do autodetection if no explicit encoding is requested
		if (encoding != encoding_auto) return encoding;

		// try to guess encoding (based on XML specification, Appendix F.1)
		const uint8_t* data = static_cast<const uint8_t*>(contents);

		return guess_buffer_encoding(data, size);
	}